

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

void __thiscall
Hospital::Add_TO_Bill
          (Hospital *this,int choose,vector<int,_std::allocator<int>_> *found,
          vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors,Patient *patient,string *cost,
          vector<Patient,_std::allocator<Patient>_> *All_Of_Patients,string *username,
          string *password)

{
  pointer pPVar1;
  __type _Var2;
  long lVar3;
  ulong uVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  temp;
  string sStack_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Human::Last_Name_Getter_abi_cxx11_
            (&sStack_b8,
             &(All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
              super__Vector_impl_data._M_start
              [(found->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[(long)choose + -1]].super_Human);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
             &sStack_b8);
  lVar3 = (long)choose + -1;
  std::__cxx11::string::~string((string *)&sStack_b8);
  Doctor::Field_getter_abi_cxx11_
            (&sStack_b8,
             (All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
             super__Vector_impl_data._M_start +
             (found->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start[lVar3]);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
             &sStack_b8);
  std::__cxx11::string::~string((string *)&sStack_b8);
  Doctor::Day_Getter_abi_cxx11_
            (&sStack_b8,
             (All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
             super__Vector_impl_data._M_start +
             (found->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start[lVar3]);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
             &sStack_b8);
  std::__cxx11::string::~string((string *)&sStack_b8);
  Doctor::Time_getter_abi_cxx11_
            (&sStack_b8,
             (All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
             super__Vector_impl_data._M_start +
             (found->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start[lVar3]);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
             &sStack_b8);
  std::__cxx11::string::~string((string *)&sStack_b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_98,cost);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_68,&local_98);
  Patient::Bill_Info_setter(patient,&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  lVar3 = 0;
  uVar4 = 0;
  do {
    pPVar1 = (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pPVar1) / 0x150) <= uVar4)
    {
LAB_001155b5:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_98);
      return;
    }
    Human::User_name_Getter_abi_cxx11_
              (&sStack_b8,(Human *)((long)&(pPVar1->super_Human).Id._M_dataplus + lVar3));
    _Var2 = std::operator==(&sStack_b8,username);
    if (_Var2) {
      Human::Password_Getter_abi_cxx11_
                (&local_50,
                 (Human *)((long)&(((All_Of_Patients->
                                    super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
                                    super__Vector_impl_data._M_start)->super_Human).Id._M_dataplus +
                          lVar3));
      _Var2 = std::operator==(&local_50,password);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&sStack_b8);
      if (_Var2) {
        pPVar1 = (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_80,&local_98);
        Patient::Bill_Info_setter
                  ((Patient *)((long)&(pPVar1->super_Human).Id._M_dataplus + lVar3),&local_80);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_80);
        goto LAB_001155b5;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&sStack_b8);
    }
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x150;
  } while( true );
}

Assistant:

void  Hospital::  Add_TO_Bill (int choose , vector<int>found , vector<Doctor>All_Of_Doctors, Patient &patient , string cost ,vector<Patient>&All_Of_Patients , string username , string password){

    vector<string>temp;

    temp.push_back(All_Of_Doctors[found[choose - 1]].Last_Name_Getter());
    temp.push_back(All_Of_Doctors[found[choose - 1]].Field_getter());
    temp.push_back(All_Of_Doctors[found[choose - 1]].Day_Getter());
    temp.push_back(All_Of_Doctors[found[choose - 1]].Time_getter());
    temp.push_back(cost);

    patient.Bill_Info_setter(temp);

    for (int i = 0; i <All_Of_Patients.size() ; ++i) {
        if(All_Of_Patients[i].User_name_Getter() == username   &&   All_Of_Patients[i].Password_Getter()==password){
            All_Of_Patients[i].Bill_Info_setter(temp);
            break;
        }
    }

}